

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *this,
                 vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *list)

{
  bool bVar1;
  DecodePsbtOutput *in_RDI;
  DecodePsbtOutput object;
  DecodePsbtOutputStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *__range3;
  DecodePsbtOutputStruct *in_stack_fffffffffffffe08;
  value_type *in_stack_fffffffffffffe18;
  vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
  *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe40;
  __normal_iterator<const_DecodePsbtOutputStruct_*,_std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (DecodePsbtOutputStruct *)
       ::std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::begin
                 (in_stack_fffffffffffffe08);
  ::std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::end
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)
             in_stack_fffffffffffffe08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_DecodePsbtOutputStruct_*,_std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_DecodePsbtOutputStruct_*,_std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>_>
                        *)in_stack_fffffffffffffe08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_DecodePsbtOutputStruct_*,_std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffe08 = (DecodePsbtOutputStruct *)&stack0xfffffffffffffe28;
    cfd::api::json::DecodePsbtOutput::DecodePsbtOutput
              ((DecodePsbtOutput *)in_stack_fffffffffffffe40);
    cfd::api::json::DecodePsbtOutput::ConvertFromStruct(in_RDI,in_stack_fffffffffffffe08);
    ::std::
    vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>::
    push_back(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    cfd::api::json::DecodePsbtOutput::~DecodePsbtOutput(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_DecodePsbtOutputStruct_*,_std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }